

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementSpring.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementSpring::SetNodes
          (ChElementSpring *this,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeB)

{
  pointer psVar1;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_48;
  ChVariables *local_30;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_28;
  
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,
             &(nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (ChVariables **)0x0;
  local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (ChVariables **)0x0;
  local_30 = (ChVariables *)
             (**(code **)(*(long *)&((((this->nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  _M_realloc_insert<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_48,
             (iterator)0x0,&local_30);
  local_30 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  if (local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_48,
               (iterator)
               local_48.
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_30);
  }
  else {
    *local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_30;
    local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            (&local_28,&local_48);
  ChKblockGeneric::SetVariables(&(this->super_ChElementGeneric).Kmatr,&local_28);
  if (local_28.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChElementSpring::SetNodes(std::shared_ptr<ChNodeFEAxyz> nodeA, std::shared_ptr<ChNodeFEAxyz> nodeB) {
    nodes[0] = nodeA;
    nodes[1] = nodeB;
    std::vector<ChVariables*> mvars;
    mvars.push_back(&nodes[0]->Variables());
    mvars.push_back(&nodes[1]->Variables());
    Kmatr.SetVariables(mvars);
}